

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2d.cpp
# Opt level: O3

void __thiscall Matrix<int,_6UL,_6UL>::dump(Matrix<int,_6UL,_6UL> *this,ostream *os)

{
  ostream *poVar1;
  int j;
  long lVar2;
  long lVar3;
  int i;
  long lVar4;
  
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar2 = 0;
    do {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)os,
                          *(int *)((long)((this->elements)._M_t.
                                          super___uniq_ptr_impl<std::array<int,_36UL>,_std::default_delete<std::array<int,_36UL>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::array<int,_36UL>_*,_std::default_delete<std::array<int,_36UL>_>_>
                                          .super__Head_base<0UL,_std::array<int,_36UL>_*,_false>.
                                         _M_head_impl)->_M_elems + lVar2 * 4 + lVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
    std::ostream::put((char)os);
    std::ostream::flush();
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x18;
  } while (lVar4 != 6);
  return;
}

Assistant:

void dump(std::ostream &os) {
    for (int i = 0; i < Row; ++i) {
      for (int j = 0; j < Col; ++j) {
        os << at(i, j) << "\t";
      }
      os << std::endl;
    }
  }